

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderAlgorithmTests.cpp
# Opt level: O0

void __thiscall
deqp::gles2::Functional::ShaderAlgorithmCase::ShaderAlgorithmCase
          (ShaderAlgorithmCase *this,Context *context,char *name,char *description,bool isVertexCase
          ,ShaderEvalFunc evalFunc,char *vertShaderSource,char *fragShaderSource)

{
  TestContext *testCtx;
  RenderContext *renderCtx;
  ContextInfo *ctxInfo;
  ShaderEvalFunc evalFunc_local;
  bool isVertexCase_local;
  char *description_local;
  char *name_local;
  Context *context_local;
  ShaderAlgorithmCase *this_local;
  
  testCtx = gles2::Context::getTestContext(context);
  renderCtx = gles2::Context::getRenderContext(context);
  ctxInfo = gles2::Context::getContextInfo(context);
  deqp::gls::ShaderRenderCase::ShaderRenderCase
            (&this->super_ShaderRenderCase,testCtx,renderCtx,ctxInfo,name,description,isVertexCase,
             evalFunc);
  (this->super_ShaderRenderCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ShaderAlgorithmCase_03288010;
  std::__cxx11::string::operator=
            ((string *)&(this->super_ShaderRenderCase).m_vertShaderSource,vertShaderSource);
  std::__cxx11::string::operator=
            ((string *)&(this->super_ShaderRenderCase).m_fragShaderSource,fragShaderSource);
  return;
}

Assistant:

ShaderAlgorithmCase::ShaderAlgorithmCase (Context& context, const char* name, const char* description, bool isVertexCase, ShaderEvalFunc evalFunc, const char* vertShaderSource, const char* fragShaderSource)
	: ShaderRenderCase(context.getTestContext(), context.getRenderContext(), context.getContextInfo(), name, description, isVertexCase, evalFunc)
{
	m_vertShaderSource	= vertShaderSource;
	m_fragShaderSource	= fragShaderSource;
}